

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O1

int fits_hcompress64(LONGLONG *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  double dVar1;
  LONGLONG *tmp;
  ulong uVar2;
  ulong uVar3;
  void *__src;
  sbyte sVar4;
  undefined4 in_register_0000000c;
  long lVar5;
  long lVar6;
  char cVar7;
  undefined4 in_register_00000014;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined4 in_register_00000034;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *err_message;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  LONGLONG *a_00;
  long *plVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  bool bVar30;
  uchar nbitplanes [3];
  LONGLONG vmax [3];
  undefined2 local_f7;
  byte local_f5;
  uint local_f4;
  ulong local_f0;
  char *local_e8;
  uint local_e0;
  uint local_dc;
  int local_d8;
  int local_d4;
  long *local_d0;
  long *local_c8;
  uint local_c0;
  int local_bc;
  ulong local_b8;
  undefined8 local_b0;
  ulong local_a8 [3];
  ulong local_90;
  LONGLONG *local_88;
  long local_80;
  int local_78;
  int local_74;
  long local_70;
  LONGLONG *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_f0 = CONCAT44(in_register_00000034,ny);
  local_b8 = CONCAT44(in_register_00000014,nx);
  local_90 = CONCAT44(in_register_0000000c,scale);
  if (0 < *status) {
    return *status;
  }
  if (ny < nx) {
    ny = nx;
  }
  local_e8 = output;
  local_c8 = nbytes;
  dVar1 = log((double)ny);
  iVar25 = (int)(dVar1 / 0.6931471805599453 + 0.5);
  tmp = (LONGLONG *)malloc((long)((ny - (ny + 1 >> 0x1f)) + 1 >> 1) << 3);
  local_d0 = a;
  local_88 = tmp;
  if (tmp == (LONGLONG *)0x0) {
    ffpmsg("htrans64: insufficient memory");
    iVar25 = 0x19d;
    tmp = local_88;
    uVar11 = local_f0;
  }
  else {
    iVar25 = (uint)(1 << ((byte)iVar25 & 0x1f) < ny) + iVar25;
    uVar11 = local_f0;
    if (0 < iVar25) {
      local_48 = (ulong)(uint)((int)local_f0 * 2);
      local_58 = local_f0 & 0xffffffff;
      local_68 = a + 1;
      local_70 = (long)(int)local_f0 << 3;
      lVar5 = 2;
      lVar21 = 1;
      local_b0 = 0xfffffffffffffffe;
      uVar2 = 0xfffffffffffffffc;
      local_80 = 1;
      local_e0 = 0;
      uVar26 = local_b8 & 0xffffffff;
      uVar3 = local_f0 & 0xffffffff;
      iVar13 = 0;
      local_78 = iVar25;
      do {
        lVar6 = local_70;
        local_dc = (uint)uVar26;
        local_c0 = (int)(uVar26 >> 0x1f) + local_dc & 0xfffffffe;
        uVar9 = (uint)uVar3;
        local_d8 = uVar9 - ((int)(uVar3 >> 0x1f) + uVar9 & 0xfffffffe);
        iVar25 = 0;
        if (0 < (int)local_c0) {
          local_bc = uVar9 - local_d8;
          local_50 = (ulong)(local_e0 ^ 1);
          lVar15 = 0;
          uVar11 = local_58;
          iVar25 = 0;
          do {
            local_d4 = iVar25;
            if (local_bc < 1) {
              iVar27 = local_d4 * (int)local_f0;
              iVar25 = (int)local_f0 + iVar27;
            }
            else {
              iVar25 = (int)uVar11;
              iVar12 = (int)lVar15;
              lVar29 = 0;
              do {
                lVar8 = local_68[iVar25 + lVar29] + local_68[(long)iVar25 + lVar29 + -1];
                lVar18 = local_68[(long)iVar12 + lVar29 + -1];
                lVar19 = local_68[iVar12 + lVar29];
                lVar23 = lVar18 + lVar19 + lVar8 >> (byte)local_e0;
                lVar17 = lVar8 - (lVar18 + lVar19) >> (byte)local_e0;
                lVar22 = local_68[iVar25 + lVar29] - local_68[(long)iVar25 + lVar29 + -1];
                lVar10 = (lVar22 + lVar19) - lVar18 >> (byte)local_e0;
                lVar8 = local_80;
                if (lVar17 < 0) {
                  lVar8 = 0;
                }
                local_68[iVar25 + lVar29] = (lVar22 - lVar19) + lVar18 >> (byte)local_e0;
                local_68[(long)iVar25 + lVar29 + -1] = lVar8 + lVar17 & local_b0;
                lVar8 = local_80;
                if (lVar10 < 0) {
                  lVar8 = 0;
                }
                local_68[iVar12 + lVar29] = lVar8 + lVar10 & local_b0;
                lVar8 = lVar5;
                if (lVar23 < 0) {
                  lVar8 = lVar21;
                }
                local_68[(long)iVar12 + lVar29 + -1] = lVar8 + lVar23 & uVar2;
                lVar29 = lVar29 + 2;
                iVar27 = (int)lVar29;
              } while (iVar27 < local_bc);
              iVar25 = iVar27 + iVar25;
              iVar27 = iVar27 + iVar12;
              a = local_d0;
              tmp = local_88;
              local_40 = uVar11;
              local_38 = lVar15;
            }
            if (local_d8 != 0) {
              sVar4 = (sbyte)(local_e0 ^ 1);
              lVar8 = a[iVar27] + a[iVar25] << sVar4;
              lVar18 = a[iVar25] - a[iVar27] << sVar4;
              lVar29 = local_80;
              if (lVar18 < 0) {
                lVar29 = 0;
              }
              lVar19 = lVar5;
              if (lVar8 < 0) {
                lVar19 = lVar21;
              }
              a[iVar25] = lVar29 + lVar18 & local_b0;
              a[iVar27] = lVar19 + lVar8 & uVar2;
            }
            iVar25 = local_d4 + 2;
            lVar15 = lVar15 + local_48;
            uVar11 = uVar11 + local_48;
            local_60 = lVar21;
          } while (iVar25 < (int)local_c0);
        }
        if (local_dc != local_c0) {
          local_d4 = iVar25 * (int)local_f0;
          if (local_d8 < (int)uVar9) {
            lVar15 = 0;
            do {
              lVar8 = local_68[(long)local_d4 + lVar15 + -1] + local_68[local_d4 + lVar15] <<
                      ((byte)local_e0 ^ 1);
              lVar18 = local_68[local_d4 + lVar15] - local_68[(long)local_d4 + lVar15 + -1] <<
                       ((byte)local_e0 ^ 1);
              lVar29 = local_80;
              if (lVar18 < 0) {
                lVar29 = 0;
              }
              local_68[local_d4 + lVar15] = lVar29 + lVar18 & local_b0;
              lVar29 = lVar5;
              if (lVar8 < 0) {
                lVar29 = lVar21;
              }
              local_68[(long)local_d4 + lVar15 + -1] = lVar29 + lVar8 & uVar2;
              lVar15 = lVar15 + 2;
            } while ((int)lVar15 < (int)(uVar9 - local_d8));
            local_d4 = local_d4 + (int)lVar15;
          }
          if (local_d8 != 0) {
            lVar15 = a[local_d4] << (2 - (byte)local_e0 & 0x3f);
            if (-1 < lVar15) {
              lVar21 = lVar5;
            }
            a[local_d4] = lVar21 + lVar15 & uVar2;
          }
        }
        a_00 = a;
        local_f4 = uVar9;
        local_b0 = uVar2;
        local_80 = lVar5;
        local_74 = iVar13;
        if (0 < (int)local_dc) {
          do {
            shuffle64(a_00,uVar9,1,tmp);
            uVar26 = uVar26 - 1;
            a_00 = (LONGLONG *)((long)a_00 + lVar6);
          } while (uVar26 != 0);
        }
        uVar28 = local_dc;
        uVar11 = local_f0;
        if (0 < (int)uVar9) {
          uVar2 = (ulong)local_f4;
          plVar24 = a;
          do {
            shuffle64(plVar24,uVar28,(int)uVar11,tmp);
            plVar24 = plVar24 + 1;
            uVar2 = uVar2 - 1;
          } while (uVar2 != 0);
        }
        uVar26 = (ulong)(uint)((int)(uVar28 + 1) >> 1);
        uVar3 = (ulong)(uint)((int)(local_f4 + 1) >> 1);
        uVar2 = local_b0 * 2;
        lVar5 = local_80 * 2;
        lVar21 = local_80 * 2 + -1;
        iVar13 = local_74 + 1;
        local_e0 = 1;
      } while (iVar13 != local_78);
    }
    free(tmp);
    iVar25 = 0;
  }
  if (tmp == (LONGLONG *)0x0) goto LAB_001c4d78;
  iVar25 = (int)local_b8;
  if ((1 < (int)local_90) && (plVar24 = a + (long)(iVar25 * (int)uVar11) + -1, a <= plVar24)) {
    uVar2 = (ulong)(((int)local_90 + 1U >> 1) - 1);
    do {
      uVar3 = -uVar2;
      if (0 < *a) {
        uVar3 = uVar2;
      }
      *a = (long)(uVar3 + *a) / (long)(local_90 & 0xffffffff);
      a = a + 1;
    } while (a <= plVar24);
  }
  lVar21 = *local_c8;
  noutmax = lVar21;
  *local_c8 = 0;
  noutchar = 0;
  if (1 < lVar21) {
    local_e8[0] = -0x23;
    local_e8[1] = -0x67;
    noutchar = 2;
  }
  uVar9 = iVar25 * (int)uVar11;
  lVar5 = 4;
  uVar2 = local_b8 & 0xffffffff;
  do {
    *(char *)((long)local_a8 + lVar5 + -1) = (char)uVar2;
    uVar2 = (ulong)(uint)((int)uVar2 >> 8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar6 = 0;
  lVar5 = noutchar;
  do {
    if (lVar5 < lVar21) {
      local_e8[lVar5] = *(char *)((long)local_a8 + lVar6);
      lVar5 = lVar5 + 1;
      noutchar = lVar5;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar5 = 4;
  uVar11 = uVar11 & 0xffffffff;
  do {
    *(char *)((long)local_a8 + lVar5 + -1) = (char)uVar11;
    uVar11 = (ulong)(uint)((int)uVar11 >> 8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar6 = 0;
  lVar5 = noutchar;
  do {
    if (lVar5 < lVar21) {
      local_e8[lVar5] = *(char *)((long)local_a8 + lVar6);
      lVar5 = lVar5 + 1;
      noutchar = lVar5;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar5 = 4;
  uVar11 = local_90;
  do {
    *(char *)((long)local_a8 + lVar5 + -1) = (char)uVar11;
    uVar11 = (ulong)(uint)((int)uVar11 >> 8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar6 = 0;
  lVar5 = noutchar;
  do {
    if (lVar5 < lVar21) {
      local_e8[lVar5] = *(char *)((long)local_a8 + lVar6);
      lVar5 = lVar5 + 1;
      noutchar = lVar5;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar5 = *local_d0;
  lVar6 = 8;
  do {
    *(char *)((long)local_a8 + lVar6 + -1) = (char)lVar5;
    lVar5 = lVar5 >> 8;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  lVar6 = 0;
  lVar5 = noutchar;
  do {
    if (lVar5 < lVar21) {
      local_e8[lVar5] = *(char *)((long)local_a8 + lVar6);
      lVar5 = lVar5 + 1;
      noutchar = lVar5;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  *local_d0 = 0;
  iVar13 = uVar9 + 0xe;
  if (-1 < (int)(uVar9 + 7)) {
    iVar13 = uVar9 + 7;
  }
  __src = calloc(1,(long)(iVar13 >> 3));
  plVar24 = local_d0;
  if (__src == (void *)0x0) {
    err_message = "encode64: insufficient memory";
  }
  else {
    if ((int)uVar9 < 1) {
      iVar13 = 8;
      uVar28 = 0;
    }
    else {
      uVar11 = 0;
      iVar13 = 8;
      uVar2 = 0;
      do {
        lVar5 = local_d0[uVar11];
        if (lVar5 < 1) {
          if (lVar5 < 0) {
            *(char *)((long)__src + uVar2) = *(char *)((long)__src + uVar2) * '\x02' + '\x01';
            iVar13 = iVar13 + -1;
            local_d0[uVar11] = -lVar5;
          }
        }
        else {
          *(char *)((long)__src + uVar2) = *(char *)((long)__src + uVar2) << 1;
          iVar13 = iVar13 + -1;
        }
        bVar30 = iVar13 == 0;
        if (bVar30) {
          iVar13 = 8;
        }
        uVar28 = (int)uVar2 + (uint)bVar30;
        uVar2 = (ulong)uVar28;
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
    if (iVar13 != 8) {
      *(char *)((long)__src + (long)(int)uVar28) =
           *(char *)((long)__src + (long)(int)uVar28) << ((byte)iVar13 & 0x1f);
      uVar28 = uVar28 + 1;
    }
    iVar13 = (iVar25 - (iVar25 + 1 >> 0x1f)) + 1 >> 1;
    iVar25 = (int)local_f0;
    iVar27 = (iVar25 - (iVar25 + 1 >> 0x1f)) + 1 >> 1;
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    if (0 < (int)uVar9) {
      uVar11 = 0;
      iVar14 = 0;
      iVar12 = 0;
      do {
        uVar20 = (uint)(iVar27 <= iVar12) + (uint)(iVar13 <= iVar14);
        uVar2 = local_d0[uVar11];
        if (local_d0[uVar11] < (long)local_a8[uVar20]) {
          uVar2 = local_a8[uVar20];
        }
        local_a8[uVar20] = uVar2;
        iVar16 = iVar12 + 1;
        iVar12 = iVar16;
        if (iVar25 <= iVar16) {
          iVar12 = 0;
        }
        iVar14 = iVar14 + (uint)(iVar25 <= iVar16);
        uVar11 = uVar11 + 1;
      } while (uVar9 != uVar11);
    }
    lVar5 = 0;
    do {
      uVar11 = local_a8[lVar5];
      cVar7 = '\0';
      uVar2 = uVar11;
      if (0 < (long)uVar11) {
        do {
          uVar11 = uVar2 >> 1;
          cVar7 = cVar7 + '\x01';
          bVar30 = 1 < uVar2;
          uVar2 = uVar11;
        } while (bVar30);
      }
      *(char *)((long)&local_f7 + lVar5) = cVar7;
      local_a8[lVar5] = uVar11;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar5 = noutchar;
    if (lVar21 < noutchar + 3) {
LAB_001c4d1e:
      *local_c8 = lVar5;
      err_message = "encode: output buffer too small";
    }
    else {
      local_e8[noutchar + 2] = local_f5;
      *(undefined2 *)(local_e8 + noutchar) = local_f7;
      buffer2 = 0;
      bits_to_go2 = 8;
      bitcount = 0;
      noutchar = noutchar + 3;
      iVar25 = qtree_encode64(local_e8,local_d0,iVar25,iVar13,iVar27,(uint)(byte)local_f7);
      if (iVar25 == 0) {
        iVar25 = qtree_encode64(local_e8,plVar24 + iVar27,(int)local_f0,iVar13,
                                (int)(((uint)(local_f0 >> 0x1f) & 1) + (int)local_f0) >> 1,
                                (uint)local_f7._1_1_);
      }
      if (iVar25 == 0) {
        iVar25 = qtree_encode64(local_e8,plVar24 + iVar13 * (int)local_f0,(int)local_f0,
                                (int)(((uint)(local_b8 >> 0x1f) & 1) + (int)local_b8) >> 1,iVar27,
                                (uint)local_f7._1_1_);
      }
      if (iVar25 == 0) {
        iVar25 = (int)local_f0;
        iVar25 = qtree_encode64(local_e8,plVar24 + (iVar13 * iVar25 + iVar27),iVar25,
                                (int)(((uint)(local_b8 >> 0x1f) & 1) + (int)local_b8) >> 1,
                                (int)(((uint)(local_f0 >> 0x1f) & 1) + iVar25) >> 1,(uint)local_f5);
      }
      output_nybble(local_e8,0);
      lVar21 = noutchar;
      lVar5 = (long)bits_to_go2;
      if (lVar5 < 8) {
        local_e8[noutchar] = (char)(buffer2 << ((byte)bits_to_go2 & 0x1f));
        if (lVar21 < noutmax) {
          noutchar = lVar21 + 1;
        }
        bitcount = bitcount + lVar5;
      }
      lVar5 = noutchar;
      if (0 < (int)uVar28) {
        lVar21 = (ulong)uVar28 + noutchar;
        if (noutmax < lVar21) {
          free(__src);
          goto LAB_001c4d1e;
        }
        memcpy(local_e8 + noutchar,__src,(ulong)uVar28);
        noutchar = lVar21;
      }
      plVar24 = local_c8;
      free(__src);
      lVar21 = noutchar;
      *plVar24 = noutchar;
      if (lVar21 < noutmax) goto LAB_001c4d78;
      err_message = "encode64: output buffer too small";
    }
  }
  ffpmsg(err_message);
  iVar25 = 0x19d;
LAB_001c4d78:
  *status = iVar25;
  return iVar25;
}

Assistant:

int fits_hcompress64(LONGLONG *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans64(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize64(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode64(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;

  *status = stat;
  return(*status);
}